

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O2

void __thiscall
GeneralizedMAAStarPlanner::SelectKBestPoliciesToProcessFurther
          (GeneralizedMAAStarPlanner *this,
          shared_ptr<PartialPolicyPoolInterface> *poolOfNextPolicies,bool are_LBs,double bestLB,
          size_t k)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  undefined3 in_register_00000011;
  ulong uVar3;
  double dVar4;
  PartialPolicyPoolInterface_sharedPtr pp_new;
  PartialPolicyPoolItemInterface_sharedPtr best_ppi;
  long *local_98;
  shared_count local_90;
  long *local_88;
  shared_count sStack_80;
  long *local_78;
  shared_count asStack_70 [2];
  double local_60;
  undefined8 local_58;
  shared_count sStack_50;
  undefined8 local_48;
  shared_count asStack_40 [2];
  
  local_60 = bestLB;
  if (CONCAT31(in_register_00000011,are_LBs) == 0) {
    (*(this->super_TimedAlgorithm)._vptr_TimedAlgorithm[5])(&local_98,this);
    uVar3 = 0;
    while( true ) {
      iVar1 = (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[0xb])();
      if (CONCAT44(extraout_var_00,iVar1) == 0) break;
      (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[6])(&local_88);
      (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[7])();
      if (uVar3 < k) {
        dVar4 = (double)(**(code **)(*local_88 + 0x18))();
        if (local_60 <= dVar4) {
          local_78 = local_88;
          asStack_70[0].pi_ = sStack_80.pi_;
          if (sStack_80.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            (sStack_80.pi_)->use_count_ = (sStack_80.pi_)->use_count_ + 1;
            UNLOCK();
          }
          (**(code **)(*local_98 + 0x40))(local_98,&local_78);
          boost::detail::shared_count::~shared_count(asStack_70);
        }
      }
      uVar3 = uVar3 + 1;
      boost::detail::shared_count::~shared_count(&sStack_80);
    }
    (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[2])(poolOfNextPolicies->px,local_98);
    while( true ) {
      lVar2 = (**(code **)(*local_98 + 0x58))();
      if (lVar2 == 0) break;
      local_58 = 0;
      sStack_50.pi_ = (sp_counted_base *)0x0;
      (**(code **)(*local_98 + 0x28))(local_98,&local_58);
      boost::detail::shared_count::~shared_count(&sStack_50);
    }
    boost::detail::shared_count::~shared_count(&local_90);
  }
  else {
    while( true ) {
      iVar1 = (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[0xb])();
      if (CONCAT44(extraout_var,iVar1) == 0) break;
      local_48 = 0;
      asStack_40[0].pi_ = (sp_counted_base *)0x0;
      (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[5])
                (poolOfNextPolicies->px,&local_48);
      boost::detail::shared_count::~shared_count(asStack_40);
    }
  }
  return;
}

Assistant:

void 
GeneralizedMAAStarPlanner::SelectKBestPoliciesToProcessFurther(
    const boost::shared_ptr<PartialPolicyPoolInterface> &poolOfNextPolicies, bool are_LBs,
    double bestLB, size_t k)
{
    if(are_LBs)
    {
        //if all policies are full policies, we don't return any
        //of them (these need not be expanded further)
        while(!poolOfNextPolicies->Empty())
            poolOfNextPolicies->Pop();
        return;
    }
    PartialPolicyPoolInterface_sharedPtr pp_new = NewPP();
    
    size_t nr_done = 0;
    while(poolOfNextPolicies->Size() > 0 ) // && nr_done < k) 
    {
        PartialPolicyPoolItemInterface_sharedPtr best_ppi = poolOfNextPolicies->GetBestRanked();
        poolOfNextPolicies->PopBestRanked();
        if(nr_done >= k || best_ppi->GetValue() < bestLB)
        {
            //we do not want this policy, so discard it:
//            delete best_ppi;
        }
        else
        {
            //we do want this policy, so store it:
            pp_new->Insert(best_ppi);
        }
        nr_done++;
    }
    //done: - free the memory of the policies in poolOfNextPolicies
    //that we will not consider further!

    *poolOfNextPolicies = *pp_new;
    //remove elements from pp_new before delete! (otherwise they will be deleted    //with them) and we get a segfault later on...
    while(pp_new->Size() > 0)
        pp_new->Pop();
    
//    delete pp_new;

}